

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O1

void __thiscall gui::DialogBox::setTitle(DialogBox *this,shared_ptr<gui::Label> *title)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  shared_ptr<gui::Widget> local_30;
  
  local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Widget;
  local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar1 = ContainerBase::hasChild((ContainerBase *)this,&local_30);
  if (local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (!bVar1) {
    this_00 = (title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (*(this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[2])(this);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  Widget::setFocusable
            (&((title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Widget,false);
  (this->title_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->title_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  updateTitle(this);
  return;
}

Assistant:

void DialogBox::setTitle(std::shared_ptr<Label> title) {
    if (!hasChild(title)) {
        addChild(title);
    }
    title->setFocusable(false);
    title_ = title;
    updateTitle();
}